

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instance.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_49dd4::Json2Array<aliyun::DrdsDescribeDrdsInstanceVipType>::Json2Array
          (Json2Array<aliyun::DrdsDescribeDrdsInstanceVipType> *this,Value *value,
          vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_88 [8];
  DrdsDescribeDrdsInstanceVipType val;
  int i;
  vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::DrdsDescribeDrdsInstanceVipType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.type.field_2._12_4_ = 0; uVar1 = val.type.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.type.field_2._12_4_ = val.type.field_2._12_4_ + 1) {
      aliyun::DrdsDescribeDrdsInstanceVipType::DrdsDescribeDrdsInstanceVipType
                ((DrdsDescribeDrdsInstanceVipType *)local_88);
      value_00 = Json::Value::operator[](value,val.type.field_2._12_4_);
      anon_unknown.dwarf_49dd4::Json2Type(value_00,(DrdsDescribeDrdsInstanceVipType *)local_88);
      std::
      vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
      ::push_back(vec,(value_type *)local_88);
      aliyun::DrdsDescribeDrdsInstanceVipType::~DrdsDescribeDrdsInstanceVipType
                ((DrdsDescribeDrdsInstanceVipType *)local_88);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }